

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O0

ValueInfo * __thiscall
ArrayValueInfo::Copy
          (ArrayValueInfo *this,JitArenaAllocator *allocator,bool copyHeadSegment,
          bool copyHeadSegmentLength,bool copyLength)

{
  ValueType valueType;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar4;
  Sym *symStore;
  ArrayValueInfo *local_60;
  StackSym *local_58;
  StackSym *local_48;
  StackSym *local_38;
  bool copyLength_local;
  bool copyHeadSegmentLength_local;
  bool copyHeadSegment_local;
  JitArenaAllocator *allocator_local;
  ArrayValueInfo *this_local;
  
  if (allocator == (JitArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.h"
                       ,0x289,"(allocator)","allocator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((((copyHeadSegment) && (this->headSegmentSym != (StackSym *)0x0)) ||
      ((copyHeadSegmentLength && (this->headSegmentLengthSym != (StackSym *)0x0)))) ||
     ((copyLength && (this->lengthSym != (StackSym *)0x0)))) {
    paVar4 = &ValueInfo::Type(&this->super_ValueInfo)->field_0;
    valueType.field_0 =
         (anon_union_2_4_ea848c7b_for_ValueType_13)
         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar4->field_0;
    if (copyHeadSegment) {
      local_38 = this->headSegmentSym;
    }
    else {
      local_38 = (StackSym *)0x0;
    }
    if (copyHeadSegmentLength) {
      local_48 = this->headSegmentLengthSym;
    }
    else {
      local_48 = (StackSym *)0x0;
    }
    if (copyLength) {
      local_58 = this->lengthSym;
    }
    else {
      local_58 = (StackSym *)0x0;
    }
    symStore = ValueInfo::GetSymStore(&this->super_ValueInfo);
    local_60 = New(allocator,valueType,local_38,local_48,local_58,symStore);
  }
  else {
    local_60 = (ArrayValueInfo *)
               ValueInfo::CopyWithGenericStructureKind(&this->super_ValueInfo,allocator);
  }
  return &local_60->super_ValueInfo;
}

Assistant:

ValueInfo *Copy(
        JitArenaAllocator *const allocator,
        const bool copyHeadSegment = true,
        const bool copyHeadSegmentLength = true,
        const bool copyLength = true) const
    {
        Assert(allocator);

        return
            (copyHeadSegment && headSegmentSym) || (copyHeadSegmentLength && headSegmentLengthSym) || (copyLength && lengthSym)
                ? New(
                    allocator,
                    Type(),
                    copyHeadSegment ? headSegmentSym : nullptr,
                    copyHeadSegmentLength ? headSegmentLengthSym : nullptr,
                    copyLength ? lengthSym : nullptr,
                    GetSymStore())
                : CopyWithGenericStructureKind(allocator);
    }